

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O2

void __thiscall FGLRenderer::SetFixedColormap(FGLRenderer *this,player_t *player)

{
  player_t *ppVar1;
  bool bVar2;
  AActor *pAVar3;
  APlayerPawn *this_00;
  DWORD DVar4;
  
  gl_fixedcolormap = 0;
  pAVar3 = GC::ReadBarrier<AActor>((AActor **)&player->camera);
  ppVar1 = pAVar3->player;
  if (ppVar1 != (player_t *)0x0) {
    if (ppVar1->fixedcolormap == -1) {
      if (ppVar1->fixedlightlevel != -1) {
        this_00 = ppVar1->mo;
LAB_003f896a:
        this_00 = (APlayerPawn *)
                  GC::ReadBarrier<AInventory>((AInventory **)&(this_00->super_AActor).Inventory);
        if (this_00 != (APlayerPawn *)0x0) {
          (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x40])(this_00);
          bVar2 = DObject::IsKindOf((DObject *)this_00,APowerTorch::RegistrationInfo.MyClass);
          if (!bVar2) goto LAB_003f89ac;
          DVar4 = (int)ppVar1->fixedlightlevel + 0x20000010;
          goto LAB_003f89c1;
        }
      }
    }
    else {
      gl_fixedcolormap = (int)ppVar1->fixedcolormap + 1;
    }
  }
  gl_RenderState.mColormapState = gl_fixedcolormap;
  return;
LAB_003f89ac:
  bVar2 = DObject::IsKindOf((DObject *)this_00,APowerLightAmp::RegistrationInfo.MyClass);
  DVar4 = 0x20000000;
  if (bVar2) {
LAB_003f89c1:
    gl_fixedcolormap = DVar4;
  }
  goto LAB_003f896a;
}

Assistant:

void FGLRenderer::SetFixedColormap (player_t *player)
{
	gl_fixedcolormap=CM_DEFAULT;

	// check for special colormaps
	player_t * cplayer = player->camera->player;
	if (cplayer) 
	{
		if (cplayer->extralight == INT_MIN)
		{
			gl_fixedcolormap=CM_FIRSTSPECIALCOLORMAP + INVERSECOLORMAP;
			extralight=0;
		}
		else if (cplayer->fixedcolormap != NOFIXEDCOLORMAP)
		{
			gl_fixedcolormap = CM_FIRSTSPECIALCOLORMAP + cplayer->fixedcolormap;
		}
		else if (cplayer->fixedlightlevel != -1)
		{
			for(AInventory * in = cplayer->mo->Inventory; in; in = in->Inventory)
			{
				PalEntry color = in->GetBlend ();

				// Need special handling for light amplifiers 
				if (in->IsKindOf(RUNTIME_CLASS(APowerTorch)))
				{
					gl_fixedcolormap = cplayer->fixedlightlevel + CM_TORCH;
				}
				else if (in->IsKindOf(RUNTIME_CLASS(APowerLightAmp)))
				{
					gl_fixedcolormap = CM_LITE;
				}
			}
		}
	}
	gl_RenderState.SetFixedColormap(gl_fixedcolormap);
}